

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IReporter> * __thiscall
Catch::Ptr<Catch::IReporter>::operator=(Ptr<Catch::IReporter> *this,IReporter *p)

{
  Ptr<Catch::IReporter> local_20;
  Ptr<Catch::IReporter> temp;
  IReporter *p_local;
  Ptr<Catch::IReporter> *this_local;
  
  temp.m_p = p;
  Ptr(&local_20,p);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }